

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_slang::parsing::Token>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::parsing::TokenKind,_void>,_std::equal_to<slang::parsing::TokenKind>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_96UL,_16UL>_>
::recover_slot(table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_slang::parsing::Token>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::parsing::TokenKind,_void>,_std::equal_to<slang::parsing::TokenKind>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_96UL,_16UL>_>
               *this,uchar *pc)

{
  bool bVar1;
  uchar *in_RSI;
  long in_RDI;
  
  bVar1 = group15<boost::unordered::detail::foa::plain_integral>::maybe_caused_overflow(in_RSI);
  *(ulong *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) - (ulong)bVar1;
  group15<boost::unordered::detail::foa::plain_integral>::reset((uchar *)0x6a37f4);
  *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + -1;
  return;
}

Assistant:

void recover_slot(unsigned char* pc) {
        /* If this slot potentially caused overflow, we decrease the maximum load
         * so that average probe length won't increase unboundedly in repeated
         * insert/erase cycles (drift).
         */
        size_ctrl.ml -= group_type::maybe_caused_overflow(pc);
        group_type::reset(pc);
        --size_ctrl.size;
    }